

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_generator.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::csharp::Generator::Generate
          (Generator *this,FileDescriptor *file,string *parameter,
          GeneratorContext *generator_context,string *error)

{
  FileDescriptor *descriptor;
  int iVar1;
  ZeroCopyOutputStream *output;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  string filename_error;
  Options cli_options;
  string filename;
  Printer printer;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b8;
  string *local_198;
  GeneratorContext *local_190;
  FileDescriptor *local_188;
  string local_180;
  undefined1 local_160 [32];
  _Alloc_hider local_140;
  size_type local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  bool local_120;
  bool local_11f;
  string local_118;
  string local_f8;
  string local_d8;
  undefined1 local_b8 [136];
  undefined4 extraout_var;
  
  local_1b8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ParseGeneratorParameter(parameter,&local_1b8);
  if (*(int *)(file + 0x8c) != 3) {
    iVar1 = std::__cxx11::string::compare(*(char **)file);
    if (iVar1 != 0) {
      bVar2 = false;
      std::__cxx11::string::_M_replace((ulong)error,0,(char *)error->_M_string_length,0x350077);
      goto LAB_002109bc;
    }
  }
  local_198 = error;
  local_190 = generator_context;
  local_188 = file;
  Options::Options((Options *)local_160);
  if (local_1b8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_1b8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      iVar1 = std::__cxx11::string::compare
                        ((char *)((long)&((local_1b8.
                                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->first).
                                         _M_dataplus._M_p + lVar3));
      if (iVar1 == 0) {
        std::__cxx11::string::_M_assign((string *)local_160);
      }
      else {
        iVar1 = std::__cxx11::string::compare
                          ((char *)((long)&((local_1b8.
                                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->first).
                                           _M_dataplus._M_p + lVar3));
        if (iVar1 == 0) {
          std::__cxx11::string::_M_assign((string *)&local_140);
          local_120 = true;
        }
        else {
          iVar1 = std::__cxx11::string::compare
                            ((char *)((long)&((local_1b8.
                                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->first).
                                             _M_dataplus._M_p + lVar3));
          if (iVar1 != 0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_b8,"Unknown generator option: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&((local_1b8.
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus.
                                   _M_p + lVar3));
            std::__cxx11::string::operator=((string *)local_198,(string *)local_b8);
            if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
              operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
            }
            bVar2 = false;
            goto LAB_00210980;
          }
          local_11f = true;
        }
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x40;
    } while (uVar4 < (ulong)((long)local_1b8.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_1b8.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 6));
  }
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"");
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,local_160._0_8_,(pointer)(local_160._0_8_ + local_160._8_8_));
  bVar2 = local_120;
  descriptor = local_188;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,local_140._M_p,local_140._M_p + local_138);
  GetOutputFile(&local_d8,descriptor,&local_f8,bVar2,&local_118,&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  bVar2 = local_d8._M_string_length != 0;
  if (local_d8._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)local_198);
  }
  else {
    iVar1 = (*local_190->_vptr_GeneratorContext[2])(local_190,&local_d8);
    output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar1);
    io::Printer::Printer((Printer *)local_b8,output,'$');
    GenerateFile(descriptor,(Printer *)local_b8,(Options *)local_160);
    io::Printer::~Printer((Printer *)local_b8);
    if (output != (ZeroCopyOutputStream *)0x0) {
      (*output->_vptr_ZeroCopyOutputStream[1])(output);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
LAB_00210980:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_p != &local_130) {
    operator_delete(local_140._M_p,local_130._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
    operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
  }
LAB_002109bc:
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_1b8);
  return bVar2;
}

Assistant:

bool Generator::Generate(
    const FileDescriptor* file,
    const string& parameter,
    GeneratorContext* generator_context,
    string* error) const {

  vector<pair<string, string> > options;
  ParseGeneratorParameter(parameter, &options);

  // We only support proto3 - but we make an exception for descriptor.proto.
  if (file->syntax() != FileDescriptor::SYNTAX_PROTO3 && !IsDescriptorProto(file)) {
    *error = "C# code generation only supports proto3 syntax";
    return false;
  }

  struct Options cli_options;

  for (int i = 0; i < options.size(); i++) {
    if (options[i].first == "file_extension") {
      cli_options.file_extension = options[i].second;
    } else if (options[i].first == "base_namespace") {
      cli_options.base_namespace = options[i].second;
      cli_options.base_namespace_specified = true;
    } else if (options[i].first == "internal_access") {
      cli_options.internal_access = true;
    } else {
      *error = "Unknown generator option: " + options[i].first;
      return false;
    }
  }

  string filename_error = "";
  std::string filename = GetOutputFile(file,
      cli_options.file_extension,
      cli_options.base_namespace_specified,
      cli_options.base_namespace,
      &filename_error);

  if (filename.empty()) {
    *error = filename_error;
    return false;
  }
  scoped_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '$');

  GenerateFile(file, &printer, &cli_options);

  return true;
}